

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::substring::insertionsort<char*,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  pos_type pVar4;
  ulong uVar5;
  iterator p1;
  iterator p2;
  value_reference local_50;
  value_reference local_40;
  
  p1.array_ = PA.array_;
  pVar4 = last.pos_;
  do {
    uVar1 = pVar4 - 1;
    if (uVar1 <= first.pos_) {
      return;
    }
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,pVar4 - 2);
    uVar5 = uVar1;
    while( true ) {
      iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar5);
      p1.pos_ = CONCAT44(extraout_var,iVar2) + PA.pos_;
      p2.pos_ = CONCAT44(extraout_var_00,iVar3) + PA.pos_;
      p2.array_ = p1.array_;
      iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      if (iVar3 < 1) break;
      do {
        local_40.array_ = last.array_;
        local_50.pos_ = uVar5 - 1;
        local_50.array_ = last.array_;
        local_40.pos_ = uVar5;
        bitmap::BitmapArray<long>::value_reference::operator=(&local_50,&local_40);
        uVar5 = uVar5 + 1;
        if (last.pos_ <= uVar5) goto LAB_00109e57;
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar5);
      } while (extraout_var_01 < 0);
    }
LAB_00109e57:
    if (iVar3 == 0) {
      iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar5);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,uVar5,~CONCAT44(extraout_var_02,iVar3));
    }
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,uVar5 - 1,CONCAT44(extraout_var,iVar2));
    pVar4 = uVar1;
  } while( true );
}

Assistant:

void insertionsort(
    StringIterator_type T, const SAIterator_type PA, SAIterator_type first,
    SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type a, b;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  for (a = last - 1; first < a; --a) {
    for (t = *(a - 1), b = a; 0 < (r = compare(T, PA + t, PA + *b, depth));) {
      do {
        *(b - 1) = *b;
      } while ((++b < last) && (*b < 0));
      if (last <= b) {
        break;
      }
    }
    if (r == 0) {
      *b = ~*b;
    }
    *(b - 1) = t;
  }
}